

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

void __thiscall QRhiWidget::~QRhiWidget(QRhiWidget *this)

{
  QRhiWidgetPrivate *this_00;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007bf120;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QRhiWidget_007bf2e8;
  this_00 = *(QRhiWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->rhi != (QRhi *)0x0) {
    QRhi::removeCleanupCallback(this_00->rhi);
    QRhiWidgetPrivate::resetRenderTargetObjects(this_00);
    QRhiWidgetPrivate::resetColorBufferObjects(this_00);
    qDeleteAll<QList<QRhiResource*>>(&this_00->pendingDeletes);
  }
  QBackingStoreRhiSupport::reset();
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QRhiWidget::~QRhiWidget()
{
    Q_D(QRhiWidget);

    if (d->rhi) {
        d->rhi->removeCleanupCallback(this);
        // rhi resources must be destroyed here, due to how QWidget teardown works;
        // it should not be left to the private object's destruction.
        d->resetRenderTargetObjects();
        d->resetColorBufferObjects();
        qDeleteAll(d->pendingDeletes);
    }

    d->offscreenRenderer.reset();
}